

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

void normalize_image_u8_to_f32(clip_image_u8 *src,clip_image_f32 *dst,float *mean,float *std)

{
  pointer puVar1;
  pointer puVar2;
  pointer pfVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = src->ny;
  dst->nx = src->nx;
  dst->ny = iVar4;
  ::std::vector<float,_std::allocator<float>_>::resize
            (&dst->buf,
             (long)(src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  puVar1 = (src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (src->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar3 = (dst->buf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar5 < (ulong)((long)puVar2 - (long)puVar1); uVar5 = uVar5 + 1) {
    pfVar3[uVar5] = ((float)puVar1[uVar5] / 255.0 - mean[uVar5 % 3]) / std[uVar5 % 3];
  }
  return;
}

Assistant:

static void normalize_image_u8_to_f32(const clip_image_u8 & src, clip_image_f32 & dst, const float mean[3], const float std[3]) {
    dst.nx = src.nx;
    dst.ny = src.ny;
    dst.buf.resize(src.buf.size());

    // TODO @ngxson : seems like this could be done more efficiently on cgraph
    for (size_t i = 0; i < src.buf.size(); ++i) {
        int c = i % 3; // rgb
        dst.buf[i] = (static_cast<float>(src.buf[i]) / 255.0f - mean[c]) / std[c];
    }
}